

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImStb::STB_TEXTEDIT_DELETECHARS(ImGuiInputTextState *obj,int pos,int n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  short sVar3;
  unsigned_short *puVar4;
  unsigned_short *puVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  puVar4 = (obj->TextW).Data;
  iVar7 = ImTextCountUtf8BytesFromStr(puVar4 + pos,puVar4 + pos + n);
  uVar1 = obj->CurLenW;
  uVar2 = obj->CurLenA;
  auVar9._4_4_ = uVar2;
  auVar9._0_4_ = uVar1;
  lVar8 = (long)pos * 2;
  auVar6 = vpinsrd_avx(ZEXT416((uint)n),iVar7,1);
  auVar9._8_8_ = 0;
  auVar6 = vpsubd_avx(auVar9,auVar6);
  obj->CurLenW = (int)auVar6._0_8_;
  obj->CurLenA = (int)((ulong)auVar6._0_8_ >> 0x20);
  puVar5 = (obj->TextW).Data;
  for (; sVar3 = *(short *)((long)puVar5 + lVar8 + (long)n * 2), sVar3 != 0; lVar8 = lVar8 + 2) {
    *(short *)((long)puVar4 + lVar8) = sVar3;
  }
  *(undefined2 *)((long)puVar4 + lVar8) = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->TextW.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text (FIXME-OPT: Use memmove)
    const ImWchar* src = obj->TextW.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}